

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred_avx2.c
# Opt level: O0

void uavs3d_ipred_ang_x_6_avx2(pel *src,pel *dst,int i_dst,int mode,int width,int height)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  int iVar8;
  long lVar9;
  int in_EDX;
  undefined8 *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  __m128i pad;
  __m128i sum2_1;
  __m128i sum1_1;
  __m128i L2_1;
  __m128i L1_1;
  __m128i L0_1;
  __m128i S1_1;
  __m128i S2_1;
  __m128i S0_1;
  __m128i offset_1;
  __m128i zero_1;
  __m128i d0;
  __m256i sum2;
  __m256i sum1;
  __m256i L2;
  __m256i L1;
  __m256i L0;
  __m256i S2;
  __m256i S1;
  __m256i S0;
  __m256i offset;
  __m256i zero;
  int i;
  int real_size;
  int line_size;
  pel first_line [128];
  int local_864;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 uStack_690;
  undefined8 uStack_688;
  int local_64c;
  byte local_640 [8];
  undefined8 auStack_638 [16];
  int local_5b8;
  int local_5b4;
  int local_5ac;
  undefined8 *local_5a8;
  undefined1 (*local_5a0) [16];
  undefined1 (*local_598) [16];
  undefined1 (*local_590) [16];
  undefined1 (*local_588) [16];
  undefined8 local_580;
  undefined8 uStack_578;
  byte *local_570;
  byte local_561;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined2 local_4c2;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  byte *local_450;
  undefined2 local_442;
  undefined1 local_440 [16];
  undefined1 auStack_430 [16];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined4 local_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined4 local_1b4;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [16];
  undefined1 auStack_190 [16];
  ulong local_180;
  undefined8 local_178;
  ulong local_170;
  undefined8 local_168;
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  ulong local_140;
  undefined8 local_138;
  ulong local_130;
  undefined8 local_128;
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  ulong local_100;
  undefined8 local_f8;
  ulong local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  byte *local_c8;
  undefined1 local_c0 [16];
  byte local_b0;
  byte local_af;
  byte local_ae;
  byte local_ad;
  byte local_ac;
  byte local_ab;
  byte local_aa;
  byte local_a9;
  byte local_a8;
  byte local_a7;
  byte local_a6;
  byte local_a5;
  byte local_a4;
  byte local_a3;
  byte local_a2;
  byte local_a1;
  undefined1 local_a0 [16];
  undefined2 local_90;
  undefined2 local_8e;
  undefined2 local_8c;
  undefined2 local_8a;
  undefined2 local_88;
  undefined2 local_86;
  undefined2 local_84;
  undefined2 local_82;
  undefined1 local_80 [32];
  undefined2 local_50;
  undefined2 local_4e;
  undefined2 local_4c;
  undefined2 local_4a;
  undefined2 local_48;
  undefined2 local_46;
  undefined2 local_44;
  undefined2 local_42;
  undefined2 local_40;
  undefined2 local_3e;
  undefined2 local_3c;
  undefined2 local_3a;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  
  iVar8 = in_R8D + in_R9D + -1;
  local_864 = iVar8;
  if (SBORROW4(iVar8,in_R8D * 2) == iVar8 + in_R8D * -2 < 0) {
    local_864 = in_R8D << 1;
  }
  local_340 = 0;
  uStack_338 = 0;
  uStack_330 = 0;
  uStack_328 = 0;
  local_442 = 2;
  local_32 = 2;
  local_34 = 2;
  local_36 = 2;
  local_38 = 2;
  local_3a = 2;
  local_3c = 2;
  local_3e = 2;
  local_40 = 2;
  local_42 = 2;
  local_44 = 2;
  local_46 = 2;
  local_48 = 2;
  local_4a = 2;
  local_4c = 2;
  local_4e = 2;
  local_50 = 2;
  auVar10 = vpinsrw_avx(ZEXT216(2),2,1);
  auVar10 = vpinsrw_avx(auVar10,2,2);
  auVar10 = vpinsrw_avx(auVar10,2,3);
  auVar10 = vpinsrw_avx(auVar10,2,4);
  auVar10 = vpinsrw_avx(auVar10,2,5);
  auVar10 = vpinsrw_avx(auVar10,2,6);
  auVar10 = vpinsrw_avx(auVar10,2,7);
  auVar11 = vpinsrw_avx(ZEXT216(2),2,1);
  auVar11 = vpinsrw_avx(auVar11,2,2);
  auVar11 = vpinsrw_avx(auVar11,2,3);
  auVar11 = vpinsrw_avx(auVar11,2,4);
  auVar11 = vpinsrw_avx(auVar11,2,5);
  auVar11 = vpinsrw_avx(auVar11,2,6);
  auVar11 = vpinsrw_avx(auVar11,2,7);
  auVar13._0_16_ = ZEXT116(0) * auVar10 + ZEXT116(1) * auVar11;
  auVar13._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar10;
  local_80 = auVar13;
  local_5a0 = (undefined1 (*) [16])(in_RDI + 2);
  local_64c = 0;
  local_5b8 = in_R9D;
  local_5b4 = in_R8D;
  local_5ac = in_EDX;
  local_5a8 = in_RSI;
  while( true ) {
    uStack_688 = auVar13._24_8_;
    uStack_690 = auVar13._16_8_;
    if (local_864 + -8 <= local_64c) break;
    local_e8 = 0;
    local_f0 = *(ulong *)(*local_5a0 + 7);
    local_f8 = 0;
    local_100 = *(ulong *)(local_5a0[-1] + 0xf);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *(ulong *)(local_5a0[-1] + 0xf);
    local_120 = vpunpcklqdq_avx(auVar10,ZEXT816(0));
    auVar14._8_8_ = 0;
    auVar14._0_8_ = *(ulong *)(*local_5a0 + 7);
    auStack_110 = vpunpcklqdq_avx(auVar14,ZEXT816(0));
    auVar6 = auStack_110;
    auVar5 = local_120;
    local_128 = 0;
    local_130 = *(ulong *)(*local_5a0 + 8);
    local_138 = 0;
    local_140 = *(ulong *)*local_5a0;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *(ulong *)*local_5a0;
    local_160 = vpunpcklqdq_avx(auVar11,ZEXT816(0));
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *(ulong *)(*local_5a0 + 8);
    auStack_150 = vpunpcklqdq_avx(auVar15,ZEXT816(0));
    auVar15 = auStack_150;
    auVar14 = local_160;
    local_168 = 0;
    local_170 = *(ulong *)(*local_5a0 + 9);
    local_178 = 0;
    local_180 = *(ulong *)(*local_5a0 + 1);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = *(ulong *)(*local_5a0 + 1);
    local_1a0 = vpunpcklqdq_avx(auVar12,ZEXT816(0));
    auVar16._8_8_ = 0;
    auVar16._0_8_ = *(ulong *)(*local_5a0 + 9);
    auStack_190 = vpunpcklqdq_avx(auVar16,ZEXT816(0));
    auVar12 = auStack_190;
    auVar11 = local_1a0;
    local_280 = local_120._0_8_;
    uStack_278 = local_120._8_8_;
    uStack_270 = auStack_110._0_8_;
    uStack_268 = auStack_110._8_8_;
    local_2a0 = 0;
    uStack_298 = 0;
    uStack_290 = 0;
    uStack_288 = 0;
    auVar1._16_8_ = auStack_110._0_8_;
    auVar1._0_16_ = local_120;
    auVar1._24_8_ = auStack_110._8_8_;
    auVar1 = vpunpcklbw_avx2(auVar1,ZEXT1632(ZEXT816(0)));
    local_2c0 = local_160._0_8_;
    uStack_2b8 = local_160._8_8_;
    uStack_2b0 = auStack_150._0_8_;
    uStack_2a8 = auStack_150._8_8_;
    local_2e0 = 0;
    uStack_2d8 = 0;
    uStack_2d0 = 0;
    uStack_2c8 = 0;
    auVar4._16_8_ = auStack_150._0_8_;
    auVar4._0_16_ = local_160;
    auVar4._24_8_ = auStack_150._8_8_;
    auVar2 = vpunpcklbw_avx2(auVar4,ZEXT1632(ZEXT816(0)));
    local_300 = local_1a0._0_8_;
    uStack_2f8 = local_1a0._8_8_;
    uStack_2f0 = auStack_190._0_8_;
    uStack_2e8 = auStack_190._8_8_;
    local_320 = 0;
    uStack_318 = 0;
    uStack_310 = 0;
    uStack_308 = 0;
    auVar3._16_8_ = auStack_190._0_8_;
    auVar3._0_16_ = local_1a0;
    auVar3._24_8_ = auStack_190._8_8_;
    auVar3 = vpunpcklbw_avx2(auVar3,ZEXT1632(ZEXT816(0)));
    local_720 = auVar1._0_8_;
    uStack_718 = auVar1._8_8_;
    uStack_710 = auVar1._16_8_;
    uStack_708 = auVar1._24_8_;
    local_740 = auVar2._0_8_;
    uStack_738 = auVar2._8_8_;
    uStack_730 = auVar2._16_8_;
    uStack_728 = auVar2._24_8_;
    local_360 = local_720;
    uStack_358 = uStack_718;
    uStack_350 = uStack_710;
    uStack_348 = uStack_708;
    local_380 = local_740;
    uStack_378 = uStack_738;
    uStack_370 = uStack_730;
    uStack_368 = uStack_728;
    auVar1 = vpaddw_avx2(auVar1,auVar2);
    local_760 = auVar3._0_8_;
    uStack_758 = auVar3._8_8_;
    uStack_750 = auVar3._16_8_;
    uStack_748 = auVar3._24_8_;
    local_3a0 = local_740;
    uStack_398 = uStack_738;
    uStack_390 = uStack_730;
    uStack_388 = uStack_728;
    local_3c0 = local_760;
    uStack_3b8 = uStack_758;
    uStack_3b0 = uStack_750;
    uStack_3a8 = uStack_748;
    auVar2 = vpaddw_avx2(auVar2,auVar3);
    local_780 = auVar1._0_8_;
    uStack_778 = auVar1._8_8_;
    uStack_770 = auVar1._16_8_;
    uStack_768 = auVar1._24_8_;
    local_7a0 = auVar2._0_8_;
    uStack_798 = auVar2._8_8_;
    uStack_790 = auVar2._16_8_;
    uStack_788 = auVar2._24_8_;
    local_3e0 = local_780;
    uStack_3d8 = uStack_778;
    uStack_3d0 = uStack_770;
    uStack_3c8 = uStack_768;
    local_400 = local_7a0;
    uStack_3f8 = uStack_798;
    uStack_3f0 = uStack_790;
    uStack_3e8 = uStack_788;
    auVar1 = vpaddw_avx2(auVar1,auVar2);
    local_780 = auVar1._0_8_;
    uStack_778 = auVar1._8_8_;
    uStack_770 = auVar1._16_8_;
    uStack_768 = auVar1._24_8_;
    local_420 = local_780;
    uStack_418 = uStack_778;
    uStack_410 = uStack_770;
    uStack_408 = uStack_768;
    local_440 = auVar13._0_16_;
    auStack_430 = auVar13._16_16_;
    auVar2._16_8_ = uStack_690;
    auVar2._0_16_ = auVar13._0_16_;
    auVar2._24_8_ = uStack_688;
    auVar1 = vpaddw_avx2(auVar1,auVar2);
    local_780 = auVar1._0_8_;
    uStack_778 = auVar1._8_8_;
    uStack_770 = auVar1._16_8_;
    uStack_768 = auVar1._24_8_;
    local_240 = local_780;
    uStack_238 = uStack_778;
    uStack_230 = uStack_770;
    uStack_228 = uStack_768;
    local_244 = 2;
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(2));
    local_780 = auVar1._0_8_;
    uStack_778 = auVar1._8_8_;
    uStack_770 = auVar1._16_8_;
    uStack_768 = auVar1._24_8_;
    local_4c0 = local_780;
    uStack_4b8 = uStack_778;
    uStack_4b0 = uStack_770;
    uStack_4a8 = uStack_768;
    local_470 = local_780;
    uStack_468 = uStack_778;
    local_480 = uStack_770;
    uStack_478 = uStack_768;
    auVar10 = vpackuswb_avx(auVar1._0_16_,auVar1._16_16_);
    local_7b0 = auVar10._0_8_;
    uStack_7a8 = auVar10._8_8_;
    local_c8 = local_640 + local_64c;
    local_e0 = local_7b0;
    uStack_d8 = uStack_7a8;
    local_1a0 = auVar11;
    auStack_190 = auVar12;
    local_160 = auVar14;
    auStack_150 = auVar15;
    local_120 = auVar5;
    auStack_110 = auVar6;
    *(undefined8 *)(local_640 + local_64c) = local_7b0;
    *(undefined8 *)((long)auStack_638 + (long)local_64c) = uStack_7a8;
    local_64c = local_64c + 0x10;
    local_5a0 = local_5a0 + 1;
  }
  if (local_64c < local_864) {
    local_560 = 0;
    uStack_558 = 0;
    local_4c2 = 2;
    local_82 = 2;
    local_84 = 2;
    local_86 = 2;
    local_88 = 2;
    local_8a = 2;
    local_8c = 2;
    local_8e = 2;
    local_90 = 2;
    auVar10 = vpinsrw_avx(ZEXT216(2),2,1);
    auVar10 = vpinsrw_avx(auVar10,2,2);
    auVar10 = vpinsrw_avx(auVar10,2,3);
    auVar10 = vpinsrw_avx(auVar10,2,4);
    auVar10 = vpinsrw_avx(auVar10,2,5);
    auVar10 = vpinsrw_avx(auVar10,2,6);
    local_a0 = vpinsrw_avx(auVar10,2,7);
    auVar14 = local_a0;
    local_588 = (undefined1 (*) [16])(local_5a0[-1] + 0xf);
    local_590 = (undefined1 (*) [16])(*local_5a0 + 1);
    local_598 = local_5a0;
    local_1d0 = *(undefined8 *)*local_588;
    uStack_1c8 = *(undefined8 *)(*local_5a0 + 7);
    local_1e0 = 0;
    uStack_1d8 = 0;
    auVar10 = vpunpcklbw_avx(*local_588,ZEXT816(0));
    local_1f0 = *(undefined8 *)*local_5a0;
    uStack_1e8 = *(undefined8 *)(*local_5a0 + 8);
    local_200 = 0;
    uStack_1f8 = 0;
    auVar11 = vpunpcklbw_avx(*local_5a0,ZEXT816(0));
    local_210 = *(undefined8 *)*local_590;
    uStack_208 = *(undefined8 *)(*local_5a0 + 9);
    local_220 = 0;
    uStack_218 = 0;
    auVar12 = vpunpcklbw_avx(*local_590,ZEXT816(0));
    local_810 = auVar10._0_8_;
    uStack_808 = auVar10._8_8_;
    local_820 = auVar11._0_8_;
    uStack_818 = auVar11._8_8_;
    local_4e0 = local_810;
    uStack_4d8 = uStack_808;
    local_4f0 = local_820;
    uStack_4e8 = uStack_818;
    auVar10 = vpaddw_avx(auVar10,auVar11);
    local_830 = auVar12._0_8_;
    uStack_828 = auVar12._8_8_;
    local_500 = local_820;
    uStack_4f8 = uStack_818;
    local_510 = local_830;
    uStack_508 = uStack_828;
    auVar11 = vpaddw_avx(auVar11,auVar12);
    local_840 = auVar10._0_8_;
    uStack_838 = auVar10._8_8_;
    local_850 = auVar11._0_8_;
    uStack_848 = auVar11._8_8_;
    local_520 = local_840;
    uStack_518 = uStack_838;
    local_530 = local_850;
    uStack_528 = uStack_848;
    auVar10 = vpaddw_avx(auVar10,auVar11);
    local_840 = auVar10._0_8_;
    uStack_838 = auVar10._8_8_;
    local_540 = local_840;
    uStack_538 = uStack_838;
    local_550 = local_a0._0_8_;
    uStack_548 = local_a0._8_8_;
    auVar10 = vpaddw_avx(auVar10,local_a0);
    local_840 = auVar10._0_8_;
    uStack_838 = auVar10._8_8_;
    local_1b0 = local_840;
    uStack_1a8 = uStack_838;
    local_1b4 = 2;
    auVar10 = vpsrlw_avx(auVar10,ZEXT416(2));
    local_840 = auVar10._0_8_;
    uStack_838 = auVar10._8_8_;
    local_490 = local_840;
    uStack_488 = uStack_838;
    local_4a0 = local_840;
    uStack_498 = uStack_838;
    auVar10 = vpackuswb_avx(auVar10,auVar10);
    local_840 = auVar10._0_8_;
    uStack_838 = auVar10._8_8_;
    local_450 = local_640 + local_64c;
    local_460 = local_840;
    uStack_458 = uStack_838;
    local_a0 = auVar14;
    *(undefined8 *)(local_640 + local_64c) = local_840;
  }
  for (local_64c = local_864; local_64c < iVar8; local_64c = local_64c + 0x10) {
    local_561 = local_640[local_864 + -1];
    local_a1 = local_561;
    local_a2 = local_561;
    local_a3 = local_561;
    local_a4 = local_561;
    local_a5 = local_561;
    local_a6 = local_561;
    local_a7 = local_561;
    local_a8 = local_561;
    local_a9 = local_561;
    local_aa = local_561;
    local_ab = local_561;
    local_ac = local_561;
    local_ad = local_561;
    local_ae = local_561;
    local_af = local_561;
    local_b0 = local_561;
    auVar10 = vpinsrb_avx(ZEXT116(local_561),(uint)local_561,1);
    auVar10 = vpinsrb_avx(auVar10,(uint)local_561,2);
    auVar10 = vpinsrb_avx(auVar10,(uint)local_561,3);
    auVar10 = vpinsrb_avx(auVar10,(uint)local_561,4);
    auVar10 = vpinsrb_avx(auVar10,(uint)local_561,5);
    auVar10 = vpinsrb_avx(auVar10,(uint)local_561,6);
    auVar10 = vpinsrb_avx(auVar10,(uint)local_561,7);
    auVar10 = vpinsrb_avx(auVar10,(uint)local_561,8);
    auVar10 = vpinsrb_avx(auVar10,(uint)local_561,9);
    auVar10 = vpinsrb_avx(auVar10,(uint)local_561,10);
    auVar10 = vpinsrb_avx(auVar10,(uint)local_561,0xb);
    auVar10 = vpinsrb_avx(auVar10,(uint)local_561,0xc);
    auVar10 = vpinsrb_avx(auVar10,(uint)local_561,0xd);
    auVar10 = vpinsrb_avx(auVar10,(uint)local_561,0xe);
    local_c0 = vpinsrb_avx(auVar10,(uint)local_561,0xf);
    auVar10 = local_c0;
    uVar7 = local_c0._8_8_;
    local_570 = local_640 + local_64c;
    local_580 = local_c0._0_8_;
    uStack_578 = local_c0._8_8_;
    *(undefined8 *)(local_640 + local_64c) = local_c0._0_8_;
    local_c0 = auVar10;
    *(undefined8 *)((long)auStack_638 + (long)local_64c) = uVar7;
  }
  if (local_5b4 == 4) {
    for (local_64c = 0; local_64c < local_5b8; local_64c = local_64c + 1) {
      *(undefined4 *)local_5a8 = *(undefined4 *)(local_640 + local_64c);
      local_5a8 = (undefined8 *)((long)local_5a8 + (long)local_5ac);
    }
  }
  else if (local_5b4 == 8) {
    for (local_64c = 0; local_64c < local_5b8; local_64c = local_64c + 1) {
      *local_5a8 = *(undefined8 *)(local_640 + local_64c);
      local_5a8 = (undefined8 *)((long)local_5a8 + (long)local_5ac);
    }
  }
  else if (local_5b4 == 0x10) {
    for (local_64c = 0; local_64c < local_5b8; local_64c = local_64c + 1) {
      *local_5a8 = *(undefined8 *)(local_640 + local_64c);
      local_5a8[1] = *(undefined8 *)((long)auStack_638 + (long)local_64c);
      local_5a8 = (undefined8 *)((long)local_5a8 + (long)local_5ac);
    }
  }
  else if (local_5b4 == 0x20) {
    for (local_64c = 0; local_64c < local_5b8; local_64c = local_64c + 1) {
      lVar9 = (long)local_64c;
      *local_5a8 = *(undefined8 *)(local_640 + lVar9);
      local_5a8[1] = *(undefined8 *)((long)auStack_638 + lVar9);
      local_5a8[2] = *(undefined8 *)((long)auStack_638 + lVar9 + 8);
      local_5a8[3] = *(undefined8 *)((long)auStack_638 + lVar9 + 0x10);
      local_5a8 = (undefined8 *)((long)local_5a8 + (long)local_5ac);
    }
  }
  else if (local_5b4 == 0x40) {
    for (local_64c = 0; local_64c < local_5b8; local_64c = local_64c + 1) {
      memcpy(local_5a8,local_640 + local_64c,0x40);
      local_5a8 = (undefined8 *)((long)local_5a8 + (long)local_5ac);
    }
  }
  return;
}

Assistant:

void uavs3d_ipred_ang_x_6_avx2(pel *src, pel *dst, int i_dst, int mode, int width, int height)
{
    ALIGNED_16(pel first_line[64 + 64]);
    int line_size = width + height - 1;
    int real_size = COM_MIN(line_size, width * 2);
    int i;
    __m256i zero = _mm256_setzero_si256();
    __m256i offset = _mm256_set1_epi16(2);
    src += 2;

    for (i = 0; i < real_size - 8; i += 16, src += 16) {
        __m256i S0 = _mm256_set_epi64x(0, *(s64 *)(src + 7), 0, *(s64 *)(src - 1));
        __m256i S1 = _mm256_set_epi64x(0, *(s64 *)(src + 8), 0, *(s64 *)(src));
        __m256i S2 = _mm256_set_epi64x(0, *(s64 *)(src + 9), 0, *(s64 *)(src + 1));

        __m256i L0 = _mm256_unpacklo_epi8(S0, zero);
        __m256i L1 = _mm256_unpacklo_epi8(S1, zero);
        __m256i L2 = _mm256_unpacklo_epi8(S2, zero);

        __m256i sum1 = _mm256_add_epi16(L0, L1);
        __m256i sum2 = _mm256_add_epi16(L1, L2);
        __m128i d0;

        sum1 = _mm256_add_epi16(sum1, sum2);

        sum1 = _mm256_add_epi16(sum1, offset);

        sum1 = _mm256_srli_epi16(sum1, 2);

        d0 = _mm_packus_epi16(_mm256_castsi256_si128(sum1), _mm256_extracti128_si256(sum1, 1));

        _mm_store_si128((__m128i *)&first_line[i], d0);
    }

    if (i < real_size) {
        __m128i zero = _mm_setzero_si128();
        __m128i offset = _mm_set1_epi16(2);
        __m128i S0 = _mm_loadu_si128((__m128i *)(src - 1));
        __m128i S2 = _mm_loadu_si128((__m128i *)(src + 1));
        __m128i S1 = _mm_loadu_si128((__m128i *)(src));

        __m128i L0 = _mm_unpacklo_epi8(S0, zero);
        __m128i L1 = _mm_unpacklo_epi8(S1, zero);
        __m128i L2 = _mm_unpacklo_epi8(S2, zero);

        __m128i sum1 = _mm_add_epi16(L0, L1);
        __m128i sum2 = _mm_add_epi16(L1, L2);

        sum1 = _mm_add_epi16(sum1, sum2);
        sum1 = _mm_add_epi16(sum1, offset);
        sum1 = _mm_srli_epi16(sum1, 2);

        sum1 = _mm_packus_epi16(sum1, sum1);
        _mm_storel_epi64((__m128i *)&first_line[i], sum1);
    }

    // padding
    for (i = real_size; i < line_size; i += 16) {
        __m128i pad = _mm_set1_epi8((char)first_line[real_size - 1]);
        _mm_storeu_si128((__m128i *)&first_line[i], pad);
    }

#define COPY_X6(w) { \
    for (i = 0; i < height; i++) { \
        memcpy(dst, first_line + i, w * sizeof(pel)); \
        dst += i_dst;\
    } \
}
    switch (width) {
    case 4:
        COPY_X6(4)
            break;
    case 8:
        COPY_X6(8)
            break;
    case 16:
        COPY_X6(16)
            break;
    case 32:
        COPY_X6(32)
            break;
    case 64:
        COPY_X6(64)
            break;
    }
}